

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

_Bool url_match_result(_Bool result,void *userdata)

{
  url_conn_match *match;
  void *userdata_local;
  _Bool result_local;
  
  if (*userdata == 0) {
    if (((*(byte *)((long)userdata + 0x18) >> 6 & 1) == 0) ||
       (*(char *)((long)userdata + 0x18) < '\0')) {
      if (((*(byte *)((long)userdata + 0x18) >> 5 & 1) != 0) &&
         ((*(ulong *)(*(long *)((long)userdata + 8) + 0xa2c) >> 0x2c & 1) != 0)) {
        if (((*(long *)((long)userdata + 8) != 0) &&
            ((*(ulong *)(*(long *)((long)userdata + 8) + 0xa2c) >> 0x1e & 1) != 0)) &&
           ((*(long *)(*(long *)((long)userdata + 8) + 0x1310) == 0 ||
            (0 < *(int *)(*(long *)(*(long *)((long)userdata + 8) + 0x1310) + 8))))) {
          Curl_infof(*(Curl_easy **)((long)userdata + 8),
                     "Found pending candidate for reuse and CURLOPT_PIPEWAIT is set");
        }
        *(byte *)((long)userdata + 0x18) = *(byte *)((long)userdata + 0x18) & 0xf7 | 8;
      }
    }
    else {
      *(byte *)((long)userdata + 0x18) = *(byte *)((long)userdata + 0x18) & 0xf7;
    }
    *(byte *)((long)userdata + 0x18) = *(byte *)((long)userdata + 0x18) & 0xef;
    userdata_local._7_1_ = false;
  }
  else {
    Curl_attach_connection(*(Curl_easy **)((long)userdata + 8),*userdata);
    userdata_local._7_1_ = true;
  }
  return userdata_local._7_1_;
}

Assistant:

static bool url_match_result(bool result, void *userdata)
{
  struct url_conn_match *match = userdata;
  (void)result;
  if(match->found) {
    /* Attach it now while still under lock, so the connection does
     * no longer appear idle and can be reaped. */
    Curl_attach_connection(match->data, match->found);
    return TRUE;
  }
  else if(match->seen_single_use_conn && !match->seen_multiplex_conn) {
    /* We've seen a single-use, existing connection to the destination and
     * no multiplexed one. It seems safe to assume that the server does
     * not support multiplexing. */
    match->wait_pipe = FALSE;
  }
  else if(match->seen_pending_conn && match->data->set.pipewait) {
    infof(match->data,
          "Found pending candidate for reuse and CURLOPT_PIPEWAIT is set");
    match->wait_pipe = TRUE;
  }
  match->force_reuse = FALSE;
  return FALSE;
}